

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O1

bool __thiscall
wallet::LegacyScriptPubKeyMan::Encrypt
          (LegacyScriptPubKeyMan *this,CKeyingMaterial *master_key,WalletBatch *batch)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  bool bVar3;
  _Base_ptr p_Var4;
  long in_FS_OFFSET;
  bool bVar5;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vchCryptedSecret;
  CKeyingMaterial vchSecret;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  CPubKey vchPubKey;
  KeyMap keys_to_encrypt;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_118;
  _Vector_base<unsigned_char,_secure_allocator<unsigned_char>_> local_f8;
  unique_lock<std::recursive_mutex> local_e0;
  uint256 local_c9;
  CPubKey local_a9;
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
  local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_e0._M_device =
       &(this->super_LegacyDataSPKM).super_FillableSigningProvider.cs_KeyStore.super_recursive_mutex
  ;
  local_e0._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_e0);
  this->encrypted_batch = batch;
  if ((this->super_LegacyDataSPKM).mapCryptedKeys._M_t._M_impl.super__Rb_tree_header._M_node_count
      == 0) {
    p_Var1 = &local_68._M_impl.super__Rb_tree_header;
    local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_68._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_68._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    std::
    _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
    ::swap(&local_68,&(this->super_LegacyDataSPKM).super_FillableSigningProvider.mapKeys._M_t);
    bVar5 = (_Rb_tree_header *)local_68._M_impl.super__Rb_tree_header._M_header._M_left == p_Var1;
    if (!bVar5) {
      p_Var4 = local_68._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        CKey::GetPubKey(&local_a9,(CKey *)&p_Var4[1]._M_right);
        lVar2 = *(long *)(p_Var4 + 2);
        local_f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_f8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_f8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<unsigned_char,secure_allocator<unsigned_char>>::
        _M_range_initialize<unsigned_char_const*>
                  ((vector<unsigned_char,secure_allocator<unsigned_char>> *)&local_f8,lVar2,
                   (ulong)(lVar2 != 0) * 0x20 + lVar2);
        local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        CPubKey::GetHash(&local_c9,&local_a9);
        bVar3 = EncryptSecret(master_key,(CKeyingMaterial *)&local_f8,&local_c9,&local_118);
        if (!bVar3) {
LAB_00c04ede:
          this->encrypted_batch = (WalletBatch *)0x0;
          if (local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_118.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_118.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_118.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          std::_Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>::~_Vector_base
                    (&local_f8);
          goto LAB_00c04f0a;
        }
        bVar3 = AddCryptedKey(this,&local_a9,&local_118);
        if (!bVar3) goto LAB_00c04ede;
        if (local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_118.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_118.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_118.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        std::_Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>::~_Vector_base(&local_f8)
        ;
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var4);
        bVar5 = (_Rb_tree_header *)p_Var4 == &local_68._M_impl.super__Rb_tree_header;
      } while (!bVar5);
    }
    this->encrypted_batch = (WalletBatch *)0x0;
LAB_00c04f0a:
    std::
    _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
    ::~_Rb_tree(&local_68);
  }
  else {
    this->encrypted_batch = (WalletBatch *)0x0;
    bVar5 = false;
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_e0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool LegacyScriptPubKeyMan::Encrypt(const CKeyingMaterial& master_key, WalletBatch* batch)
{
    LOCK(cs_KeyStore);
    encrypted_batch = batch;
    if (!mapCryptedKeys.empty()) {
        encrypted_batch = nullptr;
        return false;
    }

    KeyMap keys_to_encrypt;
    keys_to_encrypt.swap(mapKeys); // Clear mapKeys so AddCryptedKeyInner will succeed.
    for (const KeyMap::value_type& mKey : keys_to_encrypt)
    {
        const CKey &key = mKey.second;
        CPubKey vchPubKey = key.GetPubKey();
        CKeyingMaterial vchSecret{UCharCast(key.begin()), UCharCast(key.end())};
        std::vector<unsigned char> vchCryptedSecret;
        if (!EncryptSecret(master_key, vchSecret, vchPubKey.GetHash(), vchCryptedSecret)) {
            encrypted_batch = nullptr;
            return false;
        }
        if (!AddCryptedKey(vchPubKey, vchCryptedSecret)) {
            encrypted_batch = nullptr;
            return false;
        }
    }
    encrypted_batch = nullptr;
    return true;
}